

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double tinv_appx(double p,int df)

{
  double __x;
  double __x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double g4;
  double g3;
  double g2;
  double g1;
  double d;
  double x;
  double t;
  int df_local;
  double p_local;
  
  if (df < 1) {
    printf("Degree Of Freedom should be a real integer");
    exit(1);
  }
  if ((0.0 <= p) && (p <= 1.0)) {
    if ((p == 0.0) && (!NAN(p))) {
      x = -1.79e+308;
    }
    if ((p == 1.0) && (!NAN(p))) {
      x = 1.79e+308;
    }
    if ((0.0 < p) && (p < 1.0)) {
      __x = normalinv(p,0.0,1.0);
      __x_00 = (double)df;
      dVar1 = pow(__x,3.0);
      dVar2 = pow(__x,5.0);
      dVar3 = pow(__x,3.0);
      dVar4 = pow(__x_00,2.0);
      dVar5 = pow(__x,7.0);
      dVar6 = pow(__x,5.0);
      dVar7 = pow(__x,3.0);
      dVar8 = pow(__x_00,3.0);
      dVar9 = pow(__x,9.0);
      dVar10 = pow(__x,7.0);
      dVar11 = pow(__x,5.0);
      dVar12 = pow(__x,3.0);
      dVar13 = pow(__x_00,4.0);
      x = __x + (dVar1 + __x) / (__x_00 * 4.0) +
          (__x * 3.0 + dVar2 * 5.0 + dVar3 * 16.0) / (dVar4 * 96.0) +
          (__x * -15.0 + dVar7 * 17.0 + dVar5 * 3.0 + dVar6 * 19.0) / (dVar8 * 384.0) +
          (__x * -945.0 + dVar12 * -1920.0 + dVar11 * 1482.0 + dVar9 * 79.0 + dVar10 * 776.0) /
          (dVar13 * 92160.0);
    }
    return x;
  }
  printf("Probablity Values can only take values between 0.0 and 1.0");
  exit(1);
}

Assistant:

double tinv_appx(double p, int df) {
	double t,x,d,g1,g2,g3,g4;
	/*
	 * Abramowitz and Stegun Approximation 26.7.5
	 */ 
	 
	if (df <= 0) {
		printf("Degree Of Freedom should be a real integer");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	} 
	
	if ( p == 0.) {
		t = -XINFVAL;
	}
	
	if ( p == 1.) {
		t = XINFVAL;
	}
	
	if (p > 0. && p < 1.0) {
		x = normalinv(p,0.0,1.0);
		d = (double) df;
		g1 = (pow(x,3.0) + x ) / (4. * d);
		g2 = (5. * pow(x,5.0) + 16. * pow(x,3.0) + 3. * x) / (96. * pow(d, 2.0)); 
		g3 = (3. * pow(x,7.0) + 19. * pow(x,5.0) + 17. * pow(x,3.0) - 15. * x)\
		/(384. * pow(d, 3.0)); 
		g4 = (79. * pow(x,9.0) + 776. * pow(x,7.0) + 1482. * pow(x,5.0) - 1920. *\
		 pow(x,3.0) - 945. * x)/(92160. * pow(d, 4.0)); 
		 t = x + g1 + g2 + g3 + g4;
	}
	
	return t;
}